

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

int __thiscall crnlib::dynamic_string::compare(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  undefined3 in_register_00000011;
  char *pcVar4;
  
  if (CONCAT31(in_register_00000011,case_sensitive) == 0) {
    pcVar3 = crn_stricmp;
  }
  else {
    pcVar3 = strcmp;
  }
  pcVar4 = "";
  if (this->m_pStr != (char *)0x0) {
    pcVar4 = this->m_pStr;
  }
  iVar1 = (*pcVar3)(pcVar4);
  uVar2 = 0xffffffff;
  if (-1 < iVar1) {
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

int dynamic_string::compare(const char* p, bool case_sensitive) const
    {
        CRNLIB_ASSERT(p);

        const int result = (case_sensitive ? strcmp : crn_stricmp)(get_ptr_priv(), p);

        if (result < 0)
        {
            return -1;
        }
        else if (result > 0)
        {
            return 1;
        }

        return 0;
    }